

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

void * __thiscall ON_FixedSizePool::ElementFromId(ON_FixedSizePool *this,size_t id_offset,uint id)

{
  uint uVar1;
  uint uVar2;
  ulong sizeof_element;
  void **ppvVar3;
  ulong count;
  void *pvVar4;
  char *sFormat;
  undefined8 *puVar5;
  int line_number;
  undefined8 *puVar6;
  
  if (id_offset < 8) {
    sFormat = "id_offset is too small.";
    line_number = 0x394;
  }
  else {
    sizeof_element = this->m_sizeof_element;
    if (id_offset + 4 <= sizeof_element) {
      if ((undefined8 *)this->m_first_block != (undefined8 *)0x0) {
        puVar5 = (undefined8 *)this->m_first_block;
        do {
          if (puVar5 == (undefined8 *)this->m_al_block) {
            puVar6 = (undefined8 *)0x0;
            ppvVar3 = &this->m_al_element_array;
          }
          else {
            puVar6 = (undefined8 *)*puVar5;
            ppvVar3 = (void **)(puVar5 + 1);
          }
          puVar5 = puVar5 + 2;
          pvVar4 = *ppvVar3;
          uVar1 = *(uint *)((long)pvVar4 + (id_offset - sizeof_element));
          if (id <= uVar1) {
            if (uVar1 == id) {
              return (void *)((long)pvVar4 - sizeof_element);
            }
            uVar2 = *(uint *)((long)puVar5 + id_offset);
            if (uVar2 <= id) {
              if (id - uVar2 == 0) {
                return puVar5;
              }
              count = (ulong)((long)pvVar4 - (long)puVar5) / sizeof_element;
              if (count == (uVar1 - uVar2) + 1) {
                return (undefined8 *)((long)puVar5 + sizeof_element * (id - uVar2));
              }
              pvVar4 = ON_BinarySearchArrayForUnsingedInt(id,puVar5,count,sizeof_element,id_offset);
              return pvVar4;
            }
          }
          puVar5 = puVar6;
        } while (puVar6 != (undefined8 *)0x0);
      }
      return (void *)0x0;
    }
    sFormat = "id_offset is too large.";
    line_number = 0x39a;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
             ,line_number,"",sFormat);
  return (void *)0x0;
}

Assistant:

void* ON_FixedSizePool::ElementFromId(
  size_t id_offset,
  unsigned int id
  ) const
{
  const char* block;
  const char* block_end;
  const char* next_block;
  unsigned int i0, i1;
  size_t count;
  if (id_offset < sizeof(void*))
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return nullptr;
  }
  if (id_offset + sizeof(id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return nullptr;
  }

  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    i1 = *((const unsigned int*)(block_end-(m_sizeof_element-id_offset)));
    if (i1 < id)
      continue;

    if ( id == i1 )
      return (void*)(block_end-m_sizeof_element);

    i0 = *((const unsigned int*)(block + id_offset));
    if (id < i0)
      continue;

    if ( id == i0 )
      return (void*)(block);

    count = (block_end - block)/m_sizeof_element;
    if (i1 - i0 + 1 == count)
    {
      return (void*)(block + ((id-i0)*m_sizeof_element));
    }

    return (void*)ON_BinarySearchArrayForUnsingedInt(id, block, count, m_sizeof_element, id_offset );
  }

  return nullptr;
}